

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O0

void __thiscall
BlindFactor_Constractor_bytedata_Test::~BlindFactor_Constractor_bytedata_Test
          (BlindFactor_Constractor_bytedata_Test *this)

{
  BlindFactor_Constractor_bytedata_Test *this_local;
  
  ~BlindFactor_Constractor_bytedata_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BlindFactor, Constractor_bytedata) {
  ByteData bytedata(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  BlindFactor blind_factor(bytedata);
  EXPECT_STREQ(
      blind_factor.GetHex().c_str(),
      "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  EXPECT_STREQ(
      blind_factor.GetData().GetHex().c_str(),
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_FALSE(blind_factor.IsEmpty());
  ByteData bytedata_err(
      "7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_THROW((blind_factor = BlindFactor(bytedata_err)), CfdException);
}